

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
               (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                begin,__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      end,random_engine *rng,double min,double max)

{
  result_type rVar1;
  uniform_real_distribution<double> distribution;
  uniform_real_distribution<double> local_30;
  
  if ((min == max) && (!NAN(min) && !NAN(max))) {
    details::fail_fast("Precondition","min != max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                       ,"954");
  }
  local_30._M_param._M_a = min;
  local_30._M_param._M_b = max;
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_30,rng);
    (begin._M_current)->first = rVar1;
  }
  return;
}

Assistant:

inline void
random_epsilon_unique(iteratorT begin,
                      iteratorT end,
                      random_engine& rng,
                      floatingpointT min,
                      floatingpointT max)
{
    bx_expects(min != max);

    std::uniform_real_distribution<floatingpointT> distribution(min, max);

    for (; begin != end; ++begin)
        begin->first = distribution(rng);
}